

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfactoryloader.cpp
# Opt level: O1

QJsonObject __thiscall QPluginParsedMetaData::toJson(QPluginParsedMetaData *this)

{
  Data *data;
  char16_t *pcVar1;
  QCborMap this_00;
  Data *pDVar2;
  QCborContainerPrivate *pQVar3;
  Type TVar4;
  qsizetype qVar5;
  QCborContainerPrivate *pQVar6;
  qint64 qVar7;
  qsizetype extraout_RDX;
  qsizetype extraout_RDX_00;
  qsizetype extraout_RDX_01;
  qsizetype extraout_RDX_02;
  qsizetype extraout_RDX_03;
  qsizetype extraout_RDX_04;
  qsizetype extraout_RDX_05;
  qsizetype qVar8;
  QArrayData *data_00;
  long in_FS_OFFSET;
  QCborValueConstRef self;
  QString local_c8;
  QString local_a8;
  QCborValueConstRef local_88;
  QCborValueRef local_78;
  QCborMap local_60;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (this->data).n = (qint64)&DAT_aaaaaaaaaaaaaaaa;
  QJsonObject::QJsonObject((QJsonObject *)this);
  QCborValue::toMap((QCborValue *)&local_60);
  QCborMap::detach(&local_60,0);
  this_00.d.d.ptr = local_60.d.d.ptr;
  QCborMap::detach(&local_60,0);
  qVar5 = QCborMap::size(&local_60);
  if (this_00.d.d.ptr != local_60.d.d.ptr || qVar5 != 0) {
    pQVar3 = (QCborContainerPrivate *)0x0;
    qVar8 = extraout_RDX;
    do {
      pQVar6 = pQVar3;
      local_78.super_QCborValueConstRef.i =
           (long)&(pQVar6->super_QSharedData).ref.super_QAtomicInteger<int>.
                  super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
      local_88.d = (QCborContainerPrivate *)this_00.d.d.ptr;
      local_78.super_QCborValueConstRef.d = (QCborContainerPrivate *)this_00.d.d.ptr;
      local_a8.d.d = (Data *)0x0;
      local_a8.d.ptr = (char16_t *)0x0;
      local_a8.d.size = 0;
      self.i = qVar8;
      self.d = pQVar6;
      local_88.i = (qsizetype)pQVar6;
      TVar4 = QCborValueConstRef::concreteType((QCborValueConstRef *)this_00.d.d.ptr,self);
      if (TVar4 != Integer) {
        local_c8.d.d = (Data *)0x0;
        local_c8.d.ptr = (char16_t *)0x0;
        local_c8.d.size = 0;
        QCborValueConstRef::toString(&local_58,&local_88,&local_c8);
        qVar8 = local_58.d.size;
        pDVar2 = local_58.d.d;
        pcVar1 = local_a8.d.ptr;
        data = local_a8.d.d;
        local_58.d.d = local_a8.d.d;
        local_a8.d.d = pDVar2;
        local_a8.d.ptr = local_58.d.ptr;
        local_58.d.ptr = pcVar1;
        local_58.d.size = local_a8.d.size;
        local_a8.d.size = qVar8;
        qVar8 = extraout_RDX_00;
        if (&data->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          (data->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               (data->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((data->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&data->super_QArrayData,2,0x10);
            qVar8 = extraout_RDX_01;
          }
        }
        if (&(local_c8.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          data_00 = &(local_c8.d.d)->super_QArrayData;
          if (((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i != 0)
          goto switchD_002d7c82_default;
          goto LAB_002d7d7a;
        }
        goto switchD_002d7c82_default;
      }
      qVar7 = QCborValueConstRef::toInteger(&local_88,0);
      data_00 = &(local_a8.d.d)->super_QArrayData;
      qVar8 = extraout_RDX_02;
      switch(qVar7) {
      case 0:
        local_a8.d.ptr = L"version";
        local_a8.d.size = 7;
        break;
      case 1:
        local_a8.d.ptr = L"archlevel";
        goto LAB_002d7d18;
      case 2:
        local_a8.d.ptr = L"IID";
        goto LAB_002d7d3d;
      case 3:
        local_a8.d.ptr = L"className";
LAB_002d7d18:
        local_a8.d.size = 9;
        break;
      case 4:
        local_a8.d.ptr = L"MetaData";
        local_a8.d.size = 8;
        break;
      case 5:
        local_a8.d.ptr = L"URI";
LAB_002d7d3d:
        local_a8.d.size = 3;
        break;
      case 6:
        local_a8.d.ptr = L"debug";
        local_a8.d.size = 5;
        break;
      default:
        goto switchD_002d7c82_default;
      }
      local_a8.d.d = (Data *)0x0;
      if (data_00 != (QArrayData *)0x0) {
        LOCK();
        (((Data *)data_00)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (((Data *)data_00)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((Data *)data_00)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
        {
LAB_002d7d7a:
          QArrayData::deallocate(data_00,2,0x10);
          qVar8 = extraout_RDX_03;
        }
      }
switchD_002d7c82_default:
      if (local_a8.d.size != 0) {
        QCborValueRef::toJsonValue((QJsonValue *)&local_58,&local_78);
        QJsonObject::insert((QJsonObject *)this,&local_a8,(QJsonValue *)&local_58);
        QJsonValue::~QJsonValue((QJsonValue *)&local_58);
        qVar8 = extraout_RDX_04;
      }
      if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,0x10);
          qVar8 = extraout_RDX_05;
        }
      }
      pQVar3 = (QCborContainerPrivate *)
               ((long)&(pQVar6->super_QSharedData).ref.super_QAtomicInteger<int>.
                       super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 2);
    } while ((this_00.d.d.ptr != local_60.d.d.ptr) ||
            ((QCborContainerPrivate *)(qVar5 * 2 + -2) != pQVar6));
  }
  QCborMap::~QCborMap(&local_60);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (QExplicitlySharedDataPointer<QCborContainerPrivate>)
         (QExplicitlySharedDataPointer<QCborContainerPrivate>)this;
}

Assistant:

QJsonObject QPluginParsedMetaData::toJson() const
{
    // convert from the internal CBOR representation to an external JSON one
    QJsonObject o;
    for (auto it : data.toMap()) {
        QString key;
        if (it.first.isInteger()) {
            switch (it.first.toInteger()) {
#define CONVERT_TO_STRING(IntKey, StringKey, Description) \
            case int(IntKey): key = QStringLiteral(StringKey); break;
                QT_PLUGIN_FOREACH_METADATA(CONVERT_TO_STRING)
            }
        } else {
            key = it.first.toString();
        }

        if (!key.isEmpty())
            o.insert(key, it.second.toJsonValue());
    }
    return o;
}